

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

UDate __thiscall icu_63::CalendarAstronomer::getSunRiseSet(CalendarAstronomer *this,UBool rise)

{
  double dVar1;
  UDate UVar2;
  double dVar3;
  RiseSetCoordFunc func;
  CoordFunc local_20;
  
  dVar3 = this->fTime;
  dVar1 = uprv_floor_63((this->fGmtOffset + dVar3) / 86400000.0);
  this->fTime = (dVar1 * 86400000.0 - this->fGmtOffset) + 43200000.0 +
                *(double *)(&DAT_003294a0 + (ulong)(rise == '\0') * 8);
  dVar1 = uprv_getNaN_63();
  this->julianDay = dVar1;
  this->julianCentury = dVar1;
  this->sunLongitude = dVar1;
  this->meanAnomalySun = dVar1;
  this->moonLongitude = dVar1;
  this->moonEclipLong = dVar1;
  this->meanAnomalyMoon = dVar1;
  this->eclipObliquity = dVar1;
  this->siderealTime = dVar1;
  this->siderealT0 = dVar1;
  this->moonPositionSet = '\0';
  local_20._vptr_CoordFunc = (_func_int **)&PTR_eval_003e6418;
  UVar2 = riseOrSet(this,&local_20,rise,0.009302604913129777,0.009890199094634533,5000.0);
  this->fTime = dVar3;
  dVar3 = uprv_getNaN_63();
  this->julianDay = dVar3;
  this->julianCentury = dVar3;
  this->sunLongitude = dVar3;
  this->meanAnomalySun = dVar3;
  this->moonLongitude = dVar3;
  this->moonEclipLong = dVar3;
  this->meanAnomalyMoon = dVar3;
  this->eclipObliquity = dVar3;
  this->siderealTime = dVar3;
  this->siderealT0 = dVar3;
  this->moonPositionSet = '\0';
  return UVar2;
}

Assistant:

UDate CalendarAstronomer::getSunRiseSet(UBool rise)
{
    UDate t0 = fTime;

    // Make a rough guess: 6am or 6pm local time on the current day
    double noon = ClockMath::floorDivide(fTime + fGmtOffset, (double)DAY_MS)*DAY_MS - fGmtOffset + (12*HOUR_MS);

    U_DEBUG_ASTRO_MSG(("Noon=%.2lf, %sL, gmtoff %.2lf\n", noon, debug_astro_date(noon+fGmtOffset), fGmtOffset));
    setTime(noon +  ((rise ? -6 : 6) * HOUR_MS));
    U_DEBUG_ASTRO_MSG(("added %.2lf ms as a guess,\n", ((rise ? -6. : 6.) * HOUR_MS)));

    RiseSetCoordFunc func;
    double t = riseOrSet(func,
                         rise,
                         .533 * DEG_RAD,        // Angular Diameter
                         34. /60.0 * DEG_RAD,    // Refraction correction
                         MINUTE_MS / 12.);       // Desired accuracy

    setTime(t0);
    return t;
}